

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O3

void __thiscall Activation::TracePointers(Activation *this,function<void_(Sexp_**)> *func)

{
  Activation *pAVar1;
  Activation *pAVar2;
  Activation *pAVar3;
  ulong uVar4;
  Activation *local_38;
  
  pAVar2 = (Activation *)
           (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = (Activation *)
           (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pAVar1 != pAVar2) {
    uVar4 = 0;
    pAVar3 = pAVar2;
    do {
      if (pAVar3->parent != (Sexp *)0x0) {
        local_38 = pAVar3;
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00112a80;
        (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_38);
        pAVar2 = (Activation *)
                 (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar1 = (Activation *)
                 (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
      pAVar3 = (Activation *)&pAVar3->slots;
    } while (uVar4 < (ulong)((long)pAVar1 - (long)pAVar2 >> 3));
  }
  if (this->parent != (Sexp *)0x0) {
    local_38 = this;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00112a80:
      std::__throw_bad_function_call();
    }
    (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_38);
  }
  return;
}

Assistant:

void Activation::TracePointers(std::function<void(Sexp **)> func) {
  Sexp **data = slots.data();
  for (size_t i = 0; i < slots.size(); i++) {
    if (data[i] != nullptr) {
      func(&data[i]);
    }
  }

  if (parent != nullptr) {
    func(&parent);
  }
}